

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *interface_var_user,Instruction *scalar_var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_component_values)

{
  Op OVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *this_00;
  pointer *__ptr;
  __hashtable *__h;
  initializer_list<unsigned_int> init_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string message;
  
  OVar1 = interface_var_user->opcode_;
  if (OVar1 == OpLoad) {
    message._M_string_length =
         (size_type)LoadScalarVar(this,scalar_var,extra_array_index,interface_var_user);
    message._M_dataplus._M_p = (pointer)interface_var_user;
    std::
    _Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>
              ((_Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)loads_to_component_values);
  }
  else if (OVar1 == OpStore) {
    uVar3 = Instruction::GetSingleWordInOperand(interface_var_user,1);
    StoreComponentOfValueToScalarVar
              (this,uVar3,interface_var_component_indices,scalar_var,extra_array_index,
               interface_var_user);
  }
  else {
    if ((extra_array_index != (uint32_t *)0x0) && (*extra_array_index != 0)) {
      return true;
    }
    if (OVar1 == OpName) {
      this_00 = Instruction::Clone(interface_var_user,(this->super_Pass).context_);
      local_98._M_dataplus._M_p = (pointer)this_00;
      local_78._M_dataplus._M_p._0_4_ = Instruction::result_id(scalar_var);
      init_list._M_len = 1;
      init_list._M_array = (iterator)&local_78;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&message,init_list);
      Instruction::SetInOperand(this_00,0,(SmallVector<unsigned_int,_2UL> *)&message);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&message);
      IRContext::AddDebug2Inst
                ((this->super_Pass).context_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_98);
      if ((Instruction *)local_98._M_dataplus._M_p != (Instruction *)0x0) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
    }
    else {
      if (OVar1 == OpEntryPoint) {
        uVar3 = Instruction::result_id(scalar_var);
        bVar2 = ReplaceInterfaceVarInEntryPoint(this,interface_var,interface_var_user,uVar3);
        return bVar2;
      }
      if (OVar1 == OpAccessChain) {
        ReplaceAccessChainWith
                  (this,interface_var_user,interface_var_component_indices,scalar_var,
                   loads_for_access_chain_to_component_values);
      }
      else {
        if (((OVar1 != OpDecorate) && (OVar1 != OpDecorateString)) && (OVar1 != OpDecorateId)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,"Unhandled instruction",(allocator<char> *)&local_98);
          Instruction::PrettyPrint_abi_cxx11_(&local_78,interface_var_user,0x40);
          std::operator+(&local_98,"\n  ",&local_78);
          std::__cxx11::string::append((string *)&message);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          Instruction::PrettyPrint_abi_cxx11_(&local_78,interface_var,0x40);
          std::operator+(&local_98,"\nfor interface variable scalar replacement\n  ",&local_78);
          std::__cxx11::string::append((string *)&message);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          local_98.field_2._M_allocated_capacity = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&((this->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",
                     (spv_position_t *)&local_98,message._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
          return false;
        }
        uVar3 = Instruction::result_id(scalar_var);
        CloneAnnotationForVariable(this,interface_var_user,uVar3);
      }
    }
  }
  return true;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith(
    Instruction* interface_var, Instruction* interface_var_user,
    Instruction* scalar_var,
    const std::vector<uint32_t>& interface_var_component_indices,
    const uint32_t* extra_array_index,
    std::unordered_map<Instruction*, Instruction*>* loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>*
        loads_for_access_chain_to_component_values) {
  spv::Op opcode = interface_var_user->opcode();
  if (opcode == spv::Op::OpStore) {
    uint32_t value_id = interface_var_user->GetSingleWordInOperand(1);
    StoreComponentOfValueToScalarVar(value_id, interface_var_component_indices,
                                     scalar_var, extra_array_index,
                                     interface_var_user);
    return true;
  }
  if (opcode == spv::Op::OpLoad) {
    Instruction* scalar_load =
        LoadScalarVar(scalar_var, extra_array_index, interface_var_user);
    loads_to_component_values->insert({interface_var_user, scalar_load});
    return true;
  }

  // Copy OpName and annotation instructions only once. Therefore, we create
  // them only for the first element of the extra array.
  if (extra_array_index && *extra_array_index != 0) return true;

  if (opcode == spv::Op::OpDecorateId || opcode == spv::Op::OpDecorateString ||
      opcode == spv::Op::OpDecorate) {
    CloneAnnotationForVariable(interface_var_user, scalar_var->result_id());
    return true;
  }

  if (opcode == spv::Op::OpName) {
    std::unique_ptr<Instruction> new_inst(interface_var_user->Clone(context()));
    new_inst->SetInOperand(0, {scalar_var->result_id()});
    context()->AddDebug2Inst(std::move(new_inst));
    return true;
  }

  if (opcode == spv::Op::OpEntryPoint) {
    return ReplaceInterfaceVarInEntryPoint(interface_var, interface_var_user,
                                           scalar_var->result_id());
  }

  if (opcode == spv::Op::OpAccessChain) {
    ReplaceAccessChainWith(interface_var_user, interface_var_component_indices,
                           scalar_var,
                           loads_for_access_chain_to_component_values);
    return true;
  }

  std::string message("Unhandled instruction");
  message += "\n  " + interface_var_user->PrettyPrint(
                          SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  message +=
      "\nfor interface variable scalar replacement\n  " +
      interface_var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return false;
}